

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bicubic_apply_interpolation.h
# Opt level: O0

void ncnn::gridsample_2d_bicubic_apply_interpolation_p4
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  undefined8 *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  __m128 _v;
  __m128 x3_val;
  __m128 x2_val;
  __m128 x1_val;
  __m128 x0_val;
  int ii;
  int *offset_ptr;
  int i;
  float *offset_value_ptr;
  float *dstptr;
  float *srcptr;
  int q;
  __m128 value_f [4];
  __m128 y_coeffs3;
  __m128 y_coeffs2;
  __m128 y_coeffs1;
  __m128 y_coeffs0;
  __m128 x_coeffs3;
  __m128 x_coeffs2;
  __m128 x_coeffs1;
  __m128 x_coeffs0;
  int grid_size;
  int outh;
  int outw;
  int channels;
  Mat *m;
  Mat *m_2;
  Mat *m_1;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  float local_7c8;
  float fStack_7c4;
  float fStack_7c0;
  float fStack_7bc;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  int local_774;
  float *local_770;
  float local_768 [2];
  float afStack_760 [2];
  float local_758 [2];
  float afStack_750 [3];
  int local_744;
  undefined8 local_740;
  undefined8 local_738;
  undefined8 local_730;
  undefined4 local_728;
  undefined8 local_720;
  undefined4 local_718;
  undefined4 local_714;
  undefined4 local_710;
  undefined4 local_70c;
  undefined4 local_708;
  undefined8 local_700;
  float *local_6f8;
  undefined8 local_6f0;
  undefined8 local_6e8;
  undefined8 local_6e0;
  undefined4 local_6d8;
  long local_6d0;
  undefined4 local_6c8;
  undefined4 local_6c4;
  undefined4 local_6c0;
  undefined4 local_6bc;
  undefined4 local_6b8;
  undefined8 local_6b0;
  undefined8 *local_6a8;
  undefined8 local_6a0;
  undefined8 local_698;
  undefined8 local_690;
  undefined4 local_688;
  long local_680;
  undefined4 local_678;
  undefined4 local_674;
  undefined4 local_670;
  undefined4 local_66c;
  undefined4 local_668;
  undefined8 local_660;
  long local_658;
  int local_64c;
  float local_648 [2];
  undefined8 uStack_640;
  undefined1 local_638 [16];
  undefined1 local_628 [16];
  undefined1 local_618 [16];
  float local_608 [4];
  float local_5f8 [4];
  float local_5e8 [4];
  float local_5d8 [4];
  float local_5c8 [4];
  float local_5b8 [4];
  float local_5a8 [4];
  float local_598 [2];
  float afStack_590 [4];
  int local_580;
  int local_57c;
  int local_578;
  int local_574;
  undefined8 *local_568;
  long *local_560;
  long *local_558;
  undefined8 *local_550;
  undefined8 *local_548;
  undefined8 *local_540;
  undefined8 *local_530;
  undefined8 *local_520;
  undefined8 *local_510;
  undefined1 local_4ed;
  int local_4ec;
  undefined8 *local_4e0;
  undefined8 *local_4b8;
  undefined1 local_4ad;
  undefined4 local_4ac;
  undefined8 *local_4a0;
  undefined1 local_475;
  int local_474;
  undefined8 *local_468;
  undefined8 *local_440;
  long local_438;
  undefined4 local_42c;
  long local_428;
  undefined8 *local_420;
  undefined4 local_414;
  int local_410;
  int local_40c;
  undefined8 *local_408;
  undefined8 local_400;
  undefined4 local_3f4;
  long local_3f0;
  float *local_3e8;
  undefined4 local_3dc;
  int local_3d8;
  int local_3d4;
  undefined8 *local_3d0;
  long local_3c8;
  undefined4 local_3bc;
  long local_3b8;
  long local_3b0;
  undefined4 local_3a4;
  int local_3a0;
  int local_39c;
  undefined8 *local_398;
  undefined4 local_38c;
  long local_388;
  undefined4 local_37c;
  long local_378;
  undefined4 local_36c;
  long local_368;
  undefined8 *local_360;
  undefined8 *local_358;
  undefined8 *local_350;
  undefined8 *local_348;
  undefined8 *local_340;
  undefined4 local_338;
  undefined4 uStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  undefined4 local_31c;
  undefined4 local_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 local_2fc;
  undefined4 local_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 local_2bc;
  float *local_2b8;
  undefined1 *local_2b0;
  float *local_2a8;
  float *local_2a0;
  undefined1 *local_298;
  float *local_290;
  float *local_288;
  undefined1 *local_280;
  float *local_278;
  float *local_270;
  undefined8 *local_268;
  float *local_260;
  float *local_258;
  undefined8 *local_250;
  float *local_248;
  float *local_240;
  undefined8 *local_238;
  float *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 *local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 local_158 [16];
  undefined8 local_148;
  undefined8 uStack_140;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_20;
  float local_1c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  float local_4;
  
  local_574 = (int)in_RSI[7];
  local_578 = *(int *)((long)in_RSI + 0x2c);
  local_57c = (int)in_RSI[6];
  local_580 = local_578 * local_57c;
  local_568 = in_RDX;
  local_560 = in_RSI;
  local_558 = in_RDI;
  for (local_64c = 0; local_64c < local_574; local_64c = local_64c + 1) {
    local_4e0 = &local_6a0;
    local_39c = *(int *)((long)local_558 + 0x2c);
    local_3a0 = (int)local_558[6];
    local_3a4 = *(undefined4 *)((long)local_558 + 0x34);
    local_658 = *local_558 + local_558[8] * (long)local_64c * local_558[2];
    local_3b8 = local_558[2];
    local_3bc = (undefined4)local_558[3];
    local_3c8 = local_558[4];
    local_398 = &local_6a0;
    local_388 = (long)local_39c * (long)local_3a0 * local_3b8;
    local_4b8 = &local_6a0;
    local_550 = &local_6a0;
    local_468 = &local_6f0;
    local_40c = *(int *)((long)local_560 + 0x2c);
    local_410 = (int)local_560[6];
    local_414 = *(undefined4 *)((long)local_560 + 0x34);
    local_6a8 = (undefined8 *)(*local_560 + local_560[8] * (long)local_64c * local_560[2]);
    local_428 = local_560[2];
    local_42c = (undefined4)local_560[3];
    local_438 = local_560[4];
    local_408 = &local_6f0;
    local_368 = (long)local_40c * (long)local_410 * local_428;
    local_440 = &local_6f0;
    local_548 = &local_6f0;
    local_4a0 = &local_740;
    local_3d4 = *(int *)((long)local_568 + 0x2c);
    local_3d8 = *(int *)(local_568 + 6);
    local_3dc = *(undefined4 *)((long)local_568 + 0x34);
    local_6f8 = (float *)*local_568;
    local_3f0 = local_568[2];
    local_3f4 = *(undefined4 *)(local_568 + 3);
    local_400 = local_568[4];
    local_3d0 = &local_740;
    local_378 = (long)local_3d4 * (long)local_3d8 * local_3f0;
    local_360 = &local_740;
    local_540 = &local_740;
    local_668 = 0;
    local_66c = 0;
    local_670 = 0;
    local_674 = 0;
    local_688 = 0;
    local_690 = 0;
    local_698 = 0;
    local_6a0 = 0;
    local_6b8 = 0;
    local_6bc = 0;
    local_6c0 = 0;
    local_6c4 = 0;
    local_6d8 = 0;
    local_6e0 = 0;
    local_6e8 = 0;
    local_6f0 = 0;
    local_36c = 0x10;
    local_37c = 0x10;
    local_38c = 0x10;
    local_474 = local_64c;
    local_475 = 1;
    local_4ac = 0;
    local_4ad = 1;
    local_4ec = local_64c;
    local_4ed = 1;
    local_660 = 0;
    local_678 = 0;
    local_6b0 = 0;
    local_6c8 = 0;
    local_740 = 0;
    local_730 = 0;
    local_728 = 0;
    local_718 = 0;
    local_714 = 0;
    local_710 = 0;
    local_70c = 0;
    local_708 = 0;
    local_700 = 0;
    local_738 = 0;
    local_530 = local_540;
    local_520 = local_548;
    local_510 = local_550;
    local_420 = local_6a8;
    local_3e8 = local_6f8;
    local_3b0 = local_658;
    local_720 = local_400;
    local_6d0 = local_438;
    local_680 = local_3c8;
    for (local_744 = 0; local_744 < local_580; local_744 = local_744 + 1) {
      local_1c = *local_6f8;
      local_758[1] = local_1c;
      local_758[0] = local_1c;
      afStack_750[1] = local_1c;
      afStack_750[0] = local_1c;
      local_18 = local_1c;
      fStack_14 = local_1c;
      fStack_10 = local_1c;
      fStack_c = local_1c;
      local_4 = local_1c;
      cubic_interp1d_p4((__m128 *)local_598,&local_5a8,&local_5b8,&local_5c8,(__m128 *)local_758);
      local_3c = local_6f8[1];
      local_768[1] = local_3c;
      local_768[0] = local_3c;
      afStack_760[1] = local_3c;
      afStack_760[0] = local_3c;
      local_38 = local_3c;
      fStack_34 = local_3c;
      fStack_30 = local_3c;
      fStack_2c = local_3c;
      local_20 = local_3c;
      cubic_interp1d_p4(&local_5d8,&local_5e8,&local_5f8,&local_608,(__m128 *)local_768);
      local_770 = local_6f8 + 2;
      for (local_774 = 0; local_774 < 4; local_774 = local_774 + 1) {
        if ((int)*local_770 < 0) {
          local_2bc = 0;
          local_2d8 = 0;
          uStack_2d4 = 0;
          uStack_2d0 = 0;
          uStack_2cc = 0;
          local_858 = 0;
          uStack_850 = 0;
        }
        else {
          local_340 = (undefined8 *)(local_658 + (long)(int)*local_770 * 4);
          local_858 = *local_340;
          uStack_850 = local_340[1];
        }
        local_788 = local_858;
        uStack_780 = uStack_850;
        if ((int)local_770[1] < 0) {
          local_2dc = 0;
          local_2f8 = 0;
          uStack_2f4 = 0;
          uStack_2f0 = 0;
          uStack_2ec = 0;
          local_868 = 0;
          uStack_860 = 0;
        }
        else {
          local_348 = (undefined8 *)(local_658 + (long)(int)local_770[1] * 4);
          local_868 = *local_348;
          uStack_860 = local_348[1];
        }
        local_798 = local_868;
        uStack_790 = uStack_860;
        if ((int)local_770[2] < 0) {
          local_2fc = 0;
          local_318 = 0;
          uStack_314 = 0;
          uStack_310 = 0;
          uStack_30c = 0;
          local_878 = 0;
          uStack_870 = 0;
        }
        else {
          local_350 = (undefined8 *)(local_658 + (long)(int)local_770[2] * 4);
          local_878 = *local_350;
          uStack_870 = local_350[1];
        }
        local_7a8 = local_878;
        uStack_7a0 = uStack_870;
        if ((int)local_770[3] < 0) {
          local_31c = 0;
          local_338 = 0;
          uStack_334 = 0;
          uStack_330 = 0;
          uStack_32c = 0;
          local_888 = 0;
          uStack_880 = 0;
        }
        else {
          local_358 = (undefined8 *)(local_658 + (long)(int)local_770[3] * 4);
          local_888 = *local_358;
          uStack_880 = local_358[1];
        }
        local_7b8 = local_888;
        uStack_7b0 = uStack_880;
        local_58 = local_598[0];
        fStack_54 = local_598[1];
        uVar3 = _local_58;
        fStack_50 = afStack_590[0];
        fStack_4c = afStack_590[1];
        uVar4 = _fStack_50;
        local_68 = local_858;
        uVar1 = local_68;
        uStack_60 = uStack_850;
        uVar2 = uStack_60;
        local_58 = local_598[0];
        fStack_54 = local_598[1];
        fStack_50 = (float)afStack_590._0_8_;
        fStack_4c = SUB84(afStack_590._0_8_,4);
        local_68._0_4_ = (float)local_858;
        local_68._4_4_ = (float)((ulong)local_858 >> 0x20);
        uStack_60._0_4_ = (float)uStack_850;
        uStack_60._4_4_ = (float)((ulong)uStack_850 >> 0x20);
        fVar6 = local_58 * (float)local_68;
        fVar7 = fStack_54 * local_68._4_4_;
        fVar8 = fStack_50 * (float)uStack_60;
        fVar9 = fStack_4c * uStack_60._4_4_;
        lVar5 = (long)local_774;
        local_68 = uVar1;
        uStack_60 = uVar2;
        _local_58 = uVar3;
        _fStack_50 = uVar4;
        local_648[lVar5 * 4] = fVar6;
        local_648[lVar5 * 4 + 1] = fVar7;
        *(float *)(local_638 + lVar5 * 0x10 + -8) = fVar8;
        *(float *)(local_638 + lVar5 * 0x10 + -4) = fVar9;
        local_240 = local_648 + (long)local_774 * 4;
        local_230 = local_5a8;
        local_238 = &local_798;
        local_138 = (float)local_5a8._0_8_;
        fStack_134 = SUB84(local_5a8._0_8_,4);
        fStack_130 = (float)local_5a8._8_8_;
        fStack_12c = SUB84(local_5a8._8_8_,4);
        local_148._0_4_ = (float)local_868;
        local_148._4_4_ = (float)((ulong)local_868 >> 0x20);
        uStack_140._0_4_ = (float)uStack_860;
        uStack_140._4_4_ = (float)((ulong)uStack_860 >> 0x20);
        local_1f8 = local_138 * (float)local_148;
        fStack_1f4 = fStack_134 * local_148._4_4_;
        fStack_1f0 = fStack_130 * (float)uStack_140;
        fStack_1ec = fStack_12c * uStack_140._4_4_;
        uVar1 = *(undefined8 *)local_240;
        uVar2 = *(undefined8 *)(local_638 + (long)local_774 * 0x10 + -8);
        local_208._0_4_ = (float)uVar1;
        local_208._4_4_ = (float)((ulong)uVar1 >> 0x20);
        uStack_200._0_4_ = (float)uVar2;
        uStack_200._4_4_ = (float)((ulong)uVar2 >> 0x20);
        fVar6 = local_1f8 + (float)local_208;
        fVar7 = fStack_1f4 + local_208._4_4_;
        fVar8 = fStack_1f0 + (float)uStack_200;
        fVar9 = fStack_1ec + uStack_200._4_4_;
        lVar5 = (long)local_774;
        local_208 = uVar1;
        uStack_200 = uVar2;
        local_148 = local_868;
        uStack_140 = uStack_860;
        local_648[lVar5 * 4] = fVar6;
        local_648[lVar5 * 4 + 1] = fVar7;
        *(float *)(local_638 + lVar5 * 0x10 + -8) = fVar8;
        *(float *)(local_638 + lVar5 * 0x10 + -4) = fVar9;
        local_258 = local_648 + (long)local_774 * 4;
        local_248 = local_5b8;
        local_250 = &local_7a8;
        local_118 = (float)local_5b8._0_8_;
        fStack_114 = SUB84(local_5b8._0_8_,4);
        fStack_110 = (float)local_5b8._8_8_;
        fStack_10c = SUB84(local_5b8._8_8_,4);
        local_128._0_4_ = (float)local_878;
        local_128._4_4_ = (float)((ulong)local_878 >> 0x20);
        uStack_120._0_4_ = (float)uStack_870;
        uStack_120._4_4_ = (float)((ulong)uStack_870 >> 0x20);
        local_1d8 = local_118 * (float)local_128;
        fStack_1d4 = fStack_114 * local_128._4_4_;
        fStack_1d0 = fStack_110 * (float)uStack_120;
        fStack_1cc = fStack_10c * uStack_120._4_4_;
        uVar1 = *(undefined8 *)local_258;
        uVar2 = *(undefined8 *)(local_638 + (long)local_774 * 0x10 + -8);
        local_1e8._0_4_ = (float)uVar1;
        local_1e8._4_4_ = (float)((ulong)uVar1 >> 0x20);
        uStack_1e0._0_4_ = (float)uVar2;
        uStack_1e0._4_4_ = (float)((ulong)uVar2 >> 0x20);
        fVar6 = local_1d8 + (float)local_1e8;
        fVar7 = fStack_1d4 + local_1e8._4_4_;
        fVar8 = fStack_1d0 + (float)uStack_1e0;
        fVar9 = fStack_1cc + uStack_1e0._4_4_;
        lVar5 = (long)local_774;
        local_1e8 = uVar1;
        uStack_1e0 = uVar2;
        local_128 = local_878;
        uStack_120 = uStack_870;
        local_648[lVar5 * 4] = fVar6;
        local_648[lVar5 * 4 + 1] = fVar7;
        *(float *)(local_638 + lVar5 * 0x10 + -8) = fVar8;
        *(float *)(local_638 + lVar5 * 0x10 + -4) = fVar9;
        local_270 = local_648 + (long)local_774 * 4;
        local_260 = local_5c8;
        local_268 = &local_7b8;
        local_f8 = (float)local_5c8._0_8_;
        fStack_f4 = SUB84(local_5c8._0_8_,4);
        fStack_f0 = (float)local_5c8._8_8_;
        fStack_ec = SUB84(local_5c8._8_8_,4);
        local_108._0_4_ = (float)local_888;
        local_108._4_4_ = (float)((ulong)local_888 >> 0x20);
        uStack_100._0_4_ = (float)uStack_880;
        uStack_100._4_4_ = (float)((ulong)uStack_880 >> 0x20);
        local_1b8 = local_f8 * (float)local_108;
        fStack_1b4 = fStack_f4 * local_108._4_4_;
        fStack_1b0 = fStack_f0 * (float)uStack_100;
        fStack_1ac = fStack_ec * uStack_100._4_4_;
        uVar1 = *(undefined8 *)local_270;
        uVar2 = *(undefined8 *)(local_638 + (long)local_774 * 0x10 + -8);
        local_1c8._0_4_ = (float)uVar1;
        local_1c8._4_4_ = (float)((ulong)uVar1 >> 0x20);
        uStack_1c0._0_4_ = (float)uVar2;
        uStack_1c0._4_4_ = (float)((ulong)uVar2 >> 0x20);
        fVar6 = local_1b8 + (float)local_1c8;
        fVar7 = fStack_1b4 + local_1c8._4_4_;
        fVar8 = fStack_1b0 + (float)uStack_1c0;
        fVar9 = fStack_1ac + uStack_1c0._4_4_;
        lVar5 = (long)local_774;
        local_1c8 = uVar1;
        uStack_1c0 = uVar2;
        local_108 = local_888;
        uStack_100 = uStack_880;
        local_648[lVar5 * 4] = fVar6;
        local_648[lVar5 * 4 + 1] = fVar7;
        *(float *)(local_638 + lVar5 * 0x10 + -8) = fVar8;
        *(float *)(local_638 + lVar5 * 0x10 + -4) = fVar9;
        local_770 = local_770 + 4;
      }
      local_78 = (float)local_5d8._0_8_;
      fStack_74 = SUB84(local_5d8._0_8_,4);
      fStack_70 = (float)local_5d8._8_8_;
      fStack_6c = SUB84(local_5d8._8_8_,4);
      local_88 = local_648[0];
      fStack_84 = local_648[1];
      fStack_80 = (float)uStack_640;
      fStack_7c = (float)((ulong)uStack_640 >> 0x20);
      local_280 = local_638;
      local_278 = local_5e8;
      local_288 = &local_7c8;
      local_d8 = (float)local_5e8._0_8_;
      fStack_d4 = SUB84(local_5e8._0_8_,4);
      fStack_d0 = (float)local_5e8._8_8_;
      fStack_cc = SUB84(local_5e8._8_8_,4);
      local_e8 = (float)local_638._0_8_;
      fStack_e4 = SUB84(local_638._0_8_,4);
      fStack_e0 = (float)local_638._8_8_;
      fStack_dc = SUB84(local_638._8_8_,4);
      local_198 = local_d8 * local_e8;
      fStack_194 = fStack_d4 * fStack_e4;
      fStack_190 = fStack_d0 * fStack_e0;
      fStack_18c = fStack_cc * fStack_dc;
      local_1a8 = CONCAT44(fStack_74 * fStack_84,local_78 * local_88);
      uStack_1a0 = CONCAT44(fStack_6c * fStack_7c,fStack_70 * fStack_80);
      local_7c8 = local_198 + local_78 * local_88;
      fStack_7c4 = fStack_194 + fStack_74 * fStack_84;
      fStack_7c0 = fStack_190 + fStack_70 * fStack_80;
      fStack_7bc = fStack_18c + fStack_6c * fStack_7c;
      local_298 = local_628;
      local_290 = local_5f8;
      local_2a0 = &local_7c8;
      local_b8 = (float)local_5f8._0_8_;
      fStack_b4 = SUB84(local_5f8._0_8_,4);
      fStack_b0 = (float)local_5f8._8_8_;
      fStack_ac = SUB84(local_5f8._8_8_,4);
      local_c8 = (float)local_628._0_8_;
      fStack_c4 = SUB84(local_628._0_8_,4);
      fStack_c0 = (float)local_628._8_8_;
      fStack_bc = SUB84(local_628._8_8_,4);
      local_178 = local_b8 * local_c8;
      fStack_174 = fStack_b4 * fStack_c4;
      fStack_170 = fStack_b0 * fStack_c0;
      fStack_16c = fStack_ac * fStack_bc;
      local_188 = CONCAT44(fStack_7c4,local_7c8);
      uStack_180 = CONCAT44(fStack_7bc,fStack_7c0);
      local_7c8 = local_178 + local_7c8;
      fStack_7c4 = fStack_174 + fStack_7c4;
      fStack_7c0 = fStack_170 + fStack_7c0;
      fStack_7bc = fStack_16c + fStack_7bc;
      local_2b0 = local_618;
      local_2a8 = local_608;
      local_2b8 = &local_7c8;
      local_98 = (float)local_608._0_8_;
      fStack_94 = SUB84(local_608._0_8_,4);
      fStack_90 = (float)local_608._8_8_;
      fStack_8c = SUB84(local_608._8_8_,4);
      local_a8 = (float)local_618._0_8_;
      fStack_a4 = SUB84(local_618._0_8_,4);
      fStack_a0 = (float)local_618._8_8_;
      fStack_9c = SUB84(local_618._8_8_,4);
      local_158._0_4_ = local_98 * local_a8;
      local_158._4_4_ = fStack_94 * fStack_a4;
      local_158._8_4_ = fStack_90 * fStack_a0;
      local_158._12_4_ = fStack_8c * fStack_9c;
      local_168 = CONCAT44(fStack_7c4,local_7c8);
      uStack_160 = CONCAT44(fStack_7bc,fStack_7c0);
      local_7c8 = local_158._0_4_ + local_7c8;
      fStack_7c4 = local_158._4_4_ + fStack_7c4;
      fStack_7c0 = local_158._8_4_ + fStack_7c0;
      fStack_7bc = local_158._12_4_ + fStack_7bc;
      local_210 = local_6a8;
      local_228 = CONCAT44(fStack_7c4,local_7c8);
      uStack_220 = CONCAT44(fStack_7bc,fStack_7c0);
      *local_6a8 = local_228;
      local_6a8[1] = uStack_220;
      local_6a8 = local_6a8 + 2;
      local_6f8 = local_6f8 + 0x12;
    }
  }
  return;
}

Assistant:

static void gridsample_2d_bicubic_apply_interpolation_p4(const Mat& src, Mat& dst, Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int grid_size = outw * outh;

    __m128 x_coeffs0, x_coeffs1, x_coeffs2, x_coeffs3;
    __m128 y_coeffs0, y_coeffs1, y_coeffs2, y_coeffs3;
    __m128 value_f[4];

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            cubic_interp1d_p4(x_coeffs0, x_coeffs1, x_coeffs2, x_coeffs3, _mm_set_ps1(offset_value_ptr[0]));
            cubic_interp1d_p4(y_coeffs0, y_coeffs1, y_coeffs2, y_coeffs3, _mm_set_ps1(offset_value_ptr[1]));

            const int* offset_ptr = (int*)offset_value_ptr + 2;

            for (int ii = 0; ii < 4; ii++)
            {
                __m128 x0_val = offset_ptr[0] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[0]) : _mm_set1_ps(0);
                __m128 x1_val = offset_ptr[1] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[1]) : _mm_set1_ps(0);
                __m128 x2_val = offset_ptr[2] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[2]) : _mm_set1_ps(0);
                __m128 x3_val = offset_ptr[3] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[3]) : _mm_set1_ps(0);

                value_f[ii] = _mm_mul_ps(x_coeffs0, x0_val);
                value_f[ii] = _mm_comp_fmadd_ps(x_coeffs1, x1_val, value_f[ii]);
                value_f[ii] = _mm_comp_fmadd_ps(x_coeffs2, x2_val, value_f[ii]);
                value_f[ii] = _mm_comp_fmadd_ps(x_coeffs3, x3_val, value_f[ii]);

                offset_ptr += 4;
            }

            __m128 _v = _mm_mul_ps(y_coeffs0, value_f[0]);
            _v = _mm_comp_fmadd_ps(y_coeffs1, value_f[1], _v);
            _v = _mm_comp_fmadd_ps(y_coeffs2, value_f[2], _v);
            _v = _mm_comp_fmadd_ps(y_coeffs3, value_f[3], _v);
            _mm_storeu_ps(dstptr, _v);

            dstptr += 4;
            offset_value_ptr += 18;
        }
    }
}